

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O2

void R_InstallSprite(int num,spriteframewithrotate *sprtemp,int *maxframe)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  TextureHash *pTVar13;
  spriteframe_t *psVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  FTextureID *pFVar21;
  int rot;
  FTextureID *pFVar22;
  long lVar23;
  
  if (*maxframe == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    uVar18 = *maxframe + 1;
    *maxframe = uVar18;
    pFVar21 = (sprtemp->super_spriteframe_t).Texture + 1;
    pFVar22 = (sprtemp->super_spriteframe_t).Texture;
    for (lVar23 = 0; lVar23 < (int)uVar18; lVar23 = lVar23 + 1) {
      iVar4 = *(int *)&sprtemp[lVar23].super_spriteframe_t.field_0x4c;
      if (iVar4 == 1) {
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 2) {
          iVar4 = pFVar21[lVar16 + -1].texnum;
          iVar20 = pFVar21[lVar16].texnum;
          if (pFVar21[lVar16].texnum < 1) {
            pFVar21[lVar16].texnum = iVar4;
            uVar3 = sprtemp[lVar23].super_spriteframe_t.Flip;
            iVar20 = iVar4;
            if ((uVar3 >> ((uint)lVar16 & 0x1f) & 1) != 0) {
              sprtemp[lVar23].super_spriteframe_t.Flip =
                   uVar3 | (ushort)(2 << ((byte)lVar16 & 0x1f));
            }
          }
          if (iVar4 < 1) {
            pFVar21[lVar16 + -1].texnum = iVar20;
            uVar3 = sprtemp[lVar23].super_spriteframe_t.Flip;
            if ((uVar3 >> ((byte)lVar16 & 0x1f) & 2) != 0) {
              sprtemp[lVar23].super_spriteframe_t.Flip =
                   uVar3 | (ushort)(1 << ((uint)lVar16 & 0x1f));
            }
          }
        }
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          if (pFVar22[lVar16].texnum < 1) {
            I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                         sprites.Array + num,(ulong)((int)lVar23 + 0x41));
          }
        }
      }
      else if (iVar4 == 0) {
        for (lVar16 = 0; lVar16 != 0xf; lVar16 = lVar16 + 1) {
          pFVar21[lVar16].texnum = sprtemp[lVar23].super_spriteframe_t.Texture[0].texnum;
        }
        if ((sprtemp[lVar23].super_spriteframe_t.Flip & 1) != 0) {
          sprtemp[lVar23].super_spriteframe_t.Flip = 0xffff;
        }
      }
      uVar18 = *maxframe;
      pFVar21 = pFVar21 + 0x14;
      pFVar22 = pFVar22 + 0x14;
    }
    piVar15 = (int *)&(sprtemp->super_spriteframe_t).field_0x4c;
    for (lVar23 = 0; lVar23 < (int)uVar18; lVar23 = lVar23 + 1) {
      if (*piVar15 == -1) {
        *piVar15 = 0;
        piVar15[-0x11] = 0;
        piVar15[-0x10] = 0;
        piVar15[-0xf] = 0;
        piVar15[-0xe] = 0;
        piVar15[-0xd] = 0;
        piVar15[-0xc] = 0;
        piVar15[-0xb] = 0;
        piVar15[-10] = 0;
        piVar15[-9] = 0;
        piVar15[-8] = 0;
        piVar15[-7] = 0;
        piVar15[-6] = 0;
        piVar15[-5] = 0;
        piVar15[-4] = 0;
        piVar15[-3] = 0;
        piVar15[-2] = 0;
        *(undefined2 *)(piVar15 + -1) = 0;
        uVar18 = *maxframe;
      }
      piVar15 = piVar15 + 0x14;
    }
    sprites.Array[num].numframes = (BYTE)uVar18;
    uVar18 = TArray<spriteframe_t,_spriteframe_t>::Reserve(&SpriteFrames,uVar18);
    sprites.Array[num].spriteframes = (WORD)uVar18;
    psVar14 = SpriteFrames.Array;
    lVar23 = 0;
    for (lVar16 = 0; pTVar13 = TexMan.Textures.Array, uVar5 = *maxframe, lVar16 < (int)uVar5;
        lVar16 = lVar16 + 1) {
      puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0].texnum + lVar23);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[4].texnum + lVar23);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[8].texnum + lVar23);
      uVar10 = *puVar2;
      uVar11 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0xc].texnum + lVar23);
      uVar12 = puVar2[1];
      puVar1 = (undefined8 *)((long)&psVar14[(int)uVar18].Texture[0xc].texnum + lVar23);
      *puVar1 = *puVar2;
      puVar1[1] = uVar12;
      puVar2 = (undefined8 *)((long)&psVar14[(int)uVar18].Texture[8].texnum + lVar23);
      *puVar2 = uVar10;
      puVar2[1] = uVar11;
      puVar2 = (undefined8 *)((long)&psVar14[(int)uVar18].Texture[4].texnum + lVar23);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      puVar2 = (undefined8 *)((long)&psVar14[(int)uVar18].Texture[0].texnum + lVar23);
      *puVar2 = uVar6;
      puVar2[1] = uVar7;
      *(undefined2 *)((long)(psVar14[(int)uVar18].Texture + 0x10) + lVar23) =
           *(undefined2 *)((long)((sprtemp->super_spriteframe_t).Texture + 0x10) + lVar23);
      *(undefined8 *)((long)&((spriteframe_t *)(psVar14[(int)uVar18].Texture + -2))->Voxel + lVar23)
           = *(undefined8 *)
              ((long)&((spriteframe_t *)((sprtemp->super_spriteframe_t).Texture + -2))->Voxel +
              lVar23);
      lVar23 = lVar23 + 0x50;
    }
    uVar19 = 0;
    uVar17 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar17 = uVar19;
    }
    pFVar21 = (sprtemp->super_spriteframe_t).Texture;
    for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
      if (*(int *)&sprtemp[uVar19].super_spriteframe_t.field_0x4c == 1) {
        for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 1) {
          (pTVar13[pFVar21[lVar23].texnum].Texture)->Rotations = (WORD)uVar18 + (short)uVar19;
        }
      }
      pFVar21 = pFVar21 + 0x14;
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num, spriteframewithrotate *sprtemp, int &maxframe)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}